

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall tcu::LogSection::LogSection(LogSection *this,string *name,string *description)

{
  string *description_local;
  string *name_local;
  LogSection *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  return;
}

Assistant:

LogSection (const std::string& name, const std::string& description)
		: m_name		(name)
		, m_description	(description)
	{
	}